

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcAnnotationTextOccurrence,_0UL>::
         Construct(DB *db,LIST *params)

{
  IfcStyledItem *this;
  
  this = (IfcStyledItem *)operator_new(0xa8);
  *(undefined ***)&this[1].field_0x8 = &PTR__Object_008ee2a0;
  this[1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>._vptr_ObjectHelper =
       (_func_int **)0x0;
  this[1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>.aux_is_derived.
  super__Base_bitset<1UL>._M_w = (_WordT)"IfcAnnotationTextOccurrence";
  Assimp::IFC::Schema_2x3::IfcStyledItem::IfcStyledItem(this,&PTR_construction_vtable_24__009a4400);
  *(undefined ***)this = &PTR__IfcAnnotationTextOccurrence_009a4340;
  *(undefined ***)&this[1].field_0x8 = &PTR__IfcAnnotationTextOccurrence_009a43e0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>)._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcAnnotationTextOccurrence_009a4368;
  *(undefined ***)&this->field_0x70 = &PTR__IfcAnnotationTextOccurrence_009a4390;
  *(undefined ***)&this->field_0x80 = &PTR__IfcAnnotationTextOccurrence_009a43b8;
  GenericFill<Assimp::IFC::Schema_2x3::IfcAnnotationTextOccurrence>
            (db,params,(IfcAnnotationTextOccurrence *)this);
  return (Object *)(&this->field_0x0 + *(long *)(*(long *)this + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }